

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t cv_paste(EditLine *el,wint_t c)

{
  c_kill_t *pcVar1;
  long lVar2;
  size_t len;
  c_kill_t *k;
  wint_t c_local;
  EditLine *el_local;
  
  pcVar1 = &(el->el_chared).c_kill;
  lVar2 = (long)(el->el_chared).c_kill.last - (long)pcVar1->buf >> 2;
  if ((pcVar1->buf == (wchar_t *)0x0) || (lVar2 == 0)) {
    el_local._7_1_ = '\x06';
  }
  else {
    cv_undo(el);
    if ((c == 0) && ((el->el_line).cursor < (el->el_line).lastchar)) {
      (el->el_line).cursor = (el->el_line).cursor + 1;
    }
    c_insert(el,(wchar_t)lVar2);
    if ((el->el_line).lastchar < (el->el_line).cursor + lVar2) {
      el_local._7_1_ = '\x06';
    }
    else {
      memcpy((el->el_line).cursor,pcVar1->buf,lVar2 << 2);
      el_local._7_1_ = '\x04';
    }
  }
  return el_local._7_1_;
}

Assistant:

static el_action_t
cv_paste(EditLine *el, wint_t c)
{
	c_kill_t *k = &el->el_chared.c_kill;
	size_t len = (size_t)(k->last - k->buf);

	if (k->buf == NULL || len == 0)
		return CC_ERROR;
#ifdef DEBUG_PASTE
	(void) fprintf(el->el_errfile, "Paste: \"%.*ls\"\n", (int)len,
	    k->buf);
#endif

	cv_undo(el);

	if (!c && el->el_line.cursor < el->el_line.lastchar)
		el->el_line.cursor++;

	c_insert(el, (int)len);
	if (el->el_line.cursor + len > el->el_line.lastchar)
		return CC_ERROR;
	(void) memcpy(el->el_line.cursor, k->buf, len *
	    sizeof(*el->el_line.cursor));

	return CC_REFRESH;
}